

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1c9774::BuildEngineImpl::demandRule(BuildEngineImpl *this,RuleInfo *ruleInfo)

{
  __node_base *p_Var1;
  size_type *psVar2;
  StateKind SVar3;
  Epoch EVar4;
  Epoch EVar5;
  Rule *pRVar6;
  __node_ptr __n;
  __node_base_ptr p_Var7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  __buckets_ptr pp_Var10;
  BuildEngineTrace *this_00;
  pointer pKVar11;
  pointer puVar12;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
  *p_Var13;
  bool bVar14;
  int iVar15;
  long lVar16;
  undefined4 extraout_var;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
  *this_01;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var18;
  ulong uVar19;
  size_type __n_00;
  ulong uVar20;
  _Hash_node_base _Var21;
  value_type pTVar22;
  undefined1 auVar23 [16];
  __buckets_alloc_type __alloc;
  TaskInfo *taskInfo;
  new_allocator<std::__detail::_Hash_node_base_*> local_51;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
  *local_50;
  _Hash_node_base *local_48;
  value_type local_40;
  pthread_mutex_t *local_38;
  _Hash_node_base *p_Var17;
  
  EVar4 = (ruleInfo->result).builtAt;
  SVar3 = ruleInfo->state;
  EVar5 = this->currentEpoch;
  bVar14 = 1 < (int)SVar3;
  if (SVar3 == Complete) {
    bVar14 = EVar5 == EVar4;
  }
  if (!bVar14) {
    __assert_fail("ruleInfo.isScanned(this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x20c,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
  }
  if (SVar3 == Complete) {
    bVar14 = true;
    if (EVar5 != EVar4) {
LAB_001597f1:
      __assert_fail("ruleInfo.state == RuleInfo::StateKind::NeedsToRun",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                    ,0x222,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
    }
  }
  else {
    if ((SVar3 & ~IsScanning) != InProgressWaiting) {
      if (SVar3 != NeedsToRun) {
        if (SVar3 == DoesNotNeedToRun) {
          ruleInfo->state = Complete;
          (ruleInfo->result).builtAt = EVar5;
          lVar16 = std::chrono::_V2::steady_clock::now();
          (ruleInfo->result).end = (double)lVar16 / 1000000000.0;
          pRVar6 = (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
          (*pRVar6->_vptr_Rule[4])(pRVar6,this->buildEngine,1);
          return true;
        }
        goto LAB_001597f1;
      }
      pRVar6 = (ruleInfo->rule)._M_t.
               super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
               .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl;
      iVar15 = (*pRVar6->_vptr_Rule[2])(pRVar6,this->buildEngine);
      p_Var17 = (_Hash_node_base *)CONCAT44(extraout_var,iVar15);
      if (p_Var17 == (_Hash_node_base *)0x0) {
        __assert_fail("task && \"rule action returned null task\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x226,"bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
      }
      iVar15 = pthread_mutex_lock((pthread_mutex_t *)&this->taskInfosMutex);
      if (iVar15 != 0) {
        std::__throw_system_error(iVar15);
      }
      this_01 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
                 *)operator_new(0x88);
      *(undefined8 *)this_01 = 0;
      *(_Hash_node_base **)(this_01 + 8) = p_Var17;
      *(_Hash_node_base **)(this_01 + 0x10) = p_Var17;
      *(undefined8 *)(this_01 + 0x58) = 0;
      *(undefined8 *)(this_01 + 0x60) = 0;
      *(undefined8 *)(this_01 + 0x68) = 0;
      *(undefined8 *)(this_01 + 0x70) = 0;
      *(undefined8 *)(this_01 + 0x78) = 0;
      *(undefined8 *)(this_01 + 0x80) = 0;
      *(undefined8 *)(this_01 + 0x18) = 0;
      *(undefined8 *)(this_01 + 0x20) = 0;
      *(undefined8 *)(this_01 + 0x28) = 0;
      *(undefined8 *)(this_01 + 0x30) = 0;
      *(undefined8 *)(this_01 + 0x38) = 0;
      *(undefined8 *)(this_01 + 0x40) = 0;
      *(undefined8 *)(this_01 + 0x44) = 0;
      *(undefined8 *)(this_01 + 0x4c) = 0;
      __n = (__node_ptr)(this->taskInfos)._M_h._M_bucket_count;
      uVar19 = (ulong)p_Var17 % (ulong)__n;
      p_Var7 = (this->taskInfos)._M_h._M_buckets[uVar19];
      local_50 = this_01;
      if (p_Var7 != (__node_base_ptr)0x0) {
        p_Var8 = p_Var7->_M_nxt;
        p_Var9 = p_Var8[1]._M_nxt;
        do {
          if (p_Var9 == p_Var17) {
            std::__detail::
            _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<llbuild::core::Task_*const,_(anonymous_namespace)::BuildEngineImpl::TaskInfo>,_false>_>_>
            ::_M_deallocate_node(this_01,__n);
            __assert_fail("result.second && \"task already registered\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                          ,0x22b,
                          "bool (anonymous namespace)::BuildEngineImpl::demandRule(RuleInfo &)");
          }
          p_Var8 = p_Var8->_M_nxt;
        } while ((p_Var8 != (_Hash_node_base *)0x0) &&
                (p_Var9 = p_Var8[1]._M_nxt, (ulong)p_Var9 % (ulong)__n == uVar19));
      }
      local_48 = p_Var17;
      local_38 = (pthread_mutex_t *)&this->taskInfosMutex;
      auVar23 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->taskInfos)._M_h._M_rehash_policy,(ulong)__n,
                           (this->taskInfos)._M_h._M_element_count);
      __n_00 = auVar23._8_8_;
      if ((auVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __s = (this->taskInfos)._M_h._M_buckets;
      }
      else {
        if (__n_00 == 1) {
          __s = &(this->taskInfos)._M_h._M_single_bucket;
          (this->taskInfos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          (&local_51,__n_00,(void *)0x0);
          memset(__s,0,__n_00 * 8);
        }
        _Var21._M_nxt = (this->taskInfos)._M_h._M_before_begin._M_nxt;
        (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if (_Var21._M_nxt != (_Hash_node_base *)0x0) {
          p_Var1 = &(this->taskInfos)._M_h._M_before_begin;
          uVar19 = 0;
          do {
            p_Var17 = (_Var21._M_nxt)->_M_nxt;
            uVar20 = (ulong)_Var21._M_nxt[1]._M_nxt % __n_00;
            if (__s[uVar20] == (_Hash_node_base *)0x0) {
              (_Var21._M_nxt)->_M_nxt = p_Var1->_M_nxt;
              p_Var1->_M_nxt = _Var21._M_nxt;
              __s[uVar20] = p_Var1;
              if ((_Var21._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                pp_Var18 = __s + uVar19;
                goto LAB_00159617;
              }
            }
            else {
              (_Var21._M_nxt)->_M_nxt = __s[uVar20]->_M_nxt;
              pp_Var18 = &__s[uVar20]->_M_nxt;
              uVar20 = uVar19;
LAB_00159617:
              *pp_Var18 = _Var21._M_nxt;
            }
            _Var21._M_nxt = p_Var17;
            uVar19 = uVar20;
          } while (p_Var17 != (_Hash_node_base *)0x0);
        }
        pp_Var10 = (this->taskInfos)._M_h._M_buckets;
        if (&(this->taskInfos)._M_h._M_single_bucket != pp_Var10) {
          operator_delete(pp_Var10,(this->taskInfos)._M_h._M_bucket_count << 3);
        }
        (this->taskInfos)._M_h._M_bucket_count = __n_00;
        (this->taskInfos)._M_h._M_buckets = __s;
        uVar19 = (ulong)local_48 % __n_00;
      }
      p_Var17 = local_48;
      p_Var13 = local_50;
      pTVar22 = (value_type)(this_01 + 0x10);
      if (__s[uVar19] == (_Hash_node_base *)0x0) {
        p_Var8 = (this->taskInfos)._M_h._M_before_begin._M_nxt;
        *(_Hash_node_base **)&local_50->field_0x0 = p_Var8;
        (this->taskInfos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_50;
        if (p_Var8 != (_Hash_node_base *)0x0) {
          __s[(ulong)p_Var8[1]._M_nxt % (this->taskInfos)._M_h._M_bucket_count] =
               (__node_base_ptr)local_50;
          __s = (this->taskInfos)._M_h._M_buckets;
        }
        __s[uVar19] = &(this->taskInfos)._M_h._M_before_begin;
      }
      else {
        *(_Hash_node_base **)&local_50->field_0x0 = __s[uVar19]->_M_nxt;
        __s[uVar19]->_M_nxt = (_Hash_node_base *)local_50;
      }
      psVar2 = &(this->taskInfos)._M_h._M_element_count;
      *psVar2 = *psVar2 + 1;
      local_40 = pTVar22;
      pthread_mutex_unlock(local_38);
      *(RuleInfo **)(p_Var13 + 0x48) = ruleInfo;
      this_00 = (this->trace)._M_t.
                super___uniq_ptr_impl<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                ._M_t.
                super__Tuple_impl<0UL,_llbuild::core::BuildEngineTrace_*,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                .super__Head_base<0UL,_llbuild::core::BuildEngineTrace_*,_false>._M_head_impl;
      if (this_00 != (BuildEngineTrace *)0x0) {
        llbuild::core::BuildEngineTrace::createdTaskForRule
                  (this_00,(Task *)(((vector<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                                      *)&pTVar22->task)->
                                   super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                                   )._M_impl.super__Vector_impl_data._M_start,
                   (ruleInfo->rule)._M_t.
                   super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                   .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl);
      }
      ruleInfo->state = InProgressWaiting;
      (ruleInfo->inProgressInfo).pendingScanRecord = (RuleScanRecord *)pTVar22;
      pKVar11 = (ruleInfo->result).dependencies.keys.
                super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ruleInfo->result).dependencies.keys.
          super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
          super__Vector_impl_data._M_finish != pKVar11) {
        (ruleInfo->result).dependencies.keys.
        super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
        super__Vector_impl_data._M_finish = pKVar11;
      }
      puVar12 = (ruleInfo->result).dependencies.flags.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ruleInfo->result).dependencies.flags.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar12) {
        (ruleInfo->result).dependencies.flags.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar12;
      }
      (*(code *)p_Var17->_M_nxt[2]._M_nxt)(p_Var17,this,p_Var17);
      if (((ruleInfo->result).builtAt != 0) &&
         ((((ruleInfo->rule)._M_t.
            super___uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>.
            _M_t.
            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl)->signature).value ==
          (ruleInfo->result).signature.value)) {
        (*(code *)p_Var17->_M_nxt[3]._M_nxt)(p_Var17,this,p_Var17,&ruleInfo->result);
      }
      if (local_40->waitCount == 0) {
        std::
        deque<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInfo_*>_>
        ::push_back(&this->readyTaskInfos,&local_40);
      }
    }
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool demandRule(RuleInfo& ruleInfo) {
    // The rule must have already been scanned.
    assert(ruleInfo.isScanned(this));

    // If the rule is complete, we are done.
    if (ruleInfo.isComplete(this))
      return true;

    // If the rule is in progress, we don't need to do anything.
    if (ruleInfo.isInProgress())
      return false;

    // If the rule isn't marked complete, but doesn't need to actually run, then
    // just update it.
    if (ruleInfo.state == RuleInfo::StateKind::DoesNotNeedToRun) {
      ruleInfo.setComplete(this);

      // Report the status change.
      ruleInfo.rule->updateStatus(buildEngine, Rule::StatusKind::IsUpToDate);

      return true;
    }

    // Otherwise, we actually need to initiate the processing of this rule.
    assert(ruleInfo.state == RuleInfo::StateKind::NeedsToRun);

    // Create the task for this rule.
    Task* task = ruleInfo.rule->createTask(buildEngine);
    assert(task && "rule action returned null task");

    // register the task
    taskInfosMutex.lock();
    auto result = taskInfos.emplace(task, TaskInfo(task));
    assert(result.second && "task already registered");
    auto taskInfo = &(result.first)->second;
    taskInfosMutex.unlock();
    taskInfo->forRuleInfo = &ruleInfo;

    if (trace)
      trace->createdTaskForRule(taskInfo->task.get(), ruleInfo.rule.get());

    // Transition the rule state.
    ruleInfo.state = RuleInfo::StateKind::InProgressWaiting;
    ruleInfo.setPendingTaskInfo(taskInfo);

    // Reset the Rule Dependencies, which we just append to during processing,
    // but we reset the others to ensure no one ever inadvertently uses them
    // during an invalid state.
    ruleInfo.result.dependencies.clear();

    // Inform the task it should start.
    {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::Start, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->start(iface);
    }

    // Provide the task the prior result, if present.
    //
    // FIXME: This should perhaps just be lumped in with the start call? Or
    // alternately, maybe there should just be an API call to fetch this, and
    // the clients that want it can ask? It's cheap to provide here, so
    // ultimately this is mostly a matter of cleanliness.
    if (ruleInfo.result.builtAt != 0 &&
        ruleInfo.rule->signature == ruleInfo.result.signature) {
      TracingEngineTaskCallback i(EngineTaskCallbackKind::ProvidePriorValue, ruleInfo.keyID);
      TaskInterface iface{this, task};
      task->providePriorValue(iface, ruleInfo.result.value);
    }

    // If this task has no waiters, schedule it immediately for finalization.
    if (!taskInfo->waitCount) {
      readyTaskInfos.push_back(taskInfo);
    }

    return false;
  }